

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void * SetData(node *p,dataid Id,datatype Type,void *Data)

{
  ulong uVar1;
  size_t __n;
  void *pvVar2;
  ulong uVar3;
  nodedata *pnVar4;
  nodedata *__dest;
  uint uVar5;
  bool bVar6;
  ulong Type_00;
  
  uVar5 = (uint)Type & 0x3f;
  Type_00 = (ulong)uVar5;
  __n = Node_DataSize(p,Id,Type_00,Data,0x2a);
  bVar6 = __n != 0;
  if ((bVar6) && (*Data == '\0')) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (__n == uVar3) break;
      uVar1 = uVar3 + 1;
    } while (*(char *)((long)Data + uVar3) == '\0');
    bVar6 = uVar3 < __n;
  }
  if (0x29 < uVar5) {
    __assert_fail("(Type & TYPE_MASK)<MAX_PARAMTYPE",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x750,"size_t NodeTypeSize(datatype)");
  }
  if ((0x188010010U >> Type_00 & 1) == 0) {
    if (!bVar6) {
      Node_RemoveData(p,Id,Type);
      return (void *)0x0;
    }
    pnVar4 = (nodedata *)&p->Data;
    __dest = (nodedata *)0x0;
    do {
      pnVar4 = pnVar4->Next;
      if (pnVar4 == (nodedata *)0x0) goto LAB_0010ebe0;
    } while (pnVar4->Code != (Id << 8 | Type));
    __dest = pnVar4 + 1;
LAB_0010ebe0:
    if (__dest != (nodedata *)0x0) {
      if (__n != ParamSize[Type_00]) {
        __assert_fail("Size==NodeTypeSize(Type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x23f,"void *SetData(node *, dataid, datatype, const void *)");
      }
      pvVar2 = memcpy(__dest,Data,__n);
      return pvVar2;
    }
  }
  else {
    Node_RemoveData(p,Id,Type);
    if (!bVar6) {
      return (void *)0x0;
    }
  }
  pvVar2 = Node_AddData(p,Id,Type,Data);
  return pvVar2;
}

Assistant:

static void* SetData(node* p, dataid Id, datatype Type, const void* Data)
{
    size_t i,Size = Node_DataSize(p,Id,Type&TYPE_MASK,Data,META_PARAM_UNSET); // META_PARAM_UNSET is neutral for the type

    for (i=0;i<Size;++i)
        if (((uint8_t*)Data)[i])
            break;

    if (NodeTypeSize(Type)==MAXDATA) // variable size
    {
        Node_RemoveData(p,Id,Type);

        // do not write anything if the value is 0
        if (i<Size)
            return Node_AddData(p,Id,Type,Data);
        else
            return NULL; // TODO: remove the pre-existing data with Node_RemoveData() ?
    }
    else
    {
        // do not write anything if the value is 0
        if (i<Size)
        {
            void *v = Node_GetData(p,Id,Type);
            if (!v)
                return Node_AddData(p,Id,Type,Data);
            else
            {
                assert(Size==NodeTypeSize(Type));
                memcpy(v,Data,Size);
            }
            return v;
        }
        else
            Node_RemoveData(p,Id,Type);
        return NULL;
    }
}